

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

int LWZReadByte(gdIOCtx *fd,LZW_STATIC_DATA *sd,char flag,int input_code_size,int *ZeroDataBlockP)

{
  int iVar1;
  int rv;
  int *ZeroDataBlockP_local;
  int input_code_size_local;
  char flag_local;
  LZW_STATIC_DATA *sd_local;
  gdIOCtx *fd_local;
  
  iVar1 = LWZReadByte_(fd,sd,flag,input_code_size,ZeroDataBlockP);
  return iVar1;
}

Assistant:

static int
LWZReadByte(gdIOCtx *fd, LZW_STATIC_DATA *sd, char flag, int input_code_size, int *ZeroDataBlockP)
{
	int rv;

	rv = LWZReadByte_(fd, sd, flag, input_code_size, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[LWZReadByte(,%d,%d) returning %d]\n",flag,input_code_size,rv);
	}

	return rv;
}